

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreFactory.cpp
# Opt level: O2

shared_ptr<helics::Core>
helics::CoreFactory::create(CoreType type,string_view coreName,int argc,char **argv)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  RegistrationFailure *this;
  undefined4 extraout_var;
  char *pcVar4;
  char *pcVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  CoreType type_00;
  int in_register_0000003c;
  shared_ptr<helics::Core> *core;
  shared_ptr<helics::Core> sVar6;
  string_view name;
  string_view message;
  allocator<char> local_c5;
  CoreType newType;
  _Alloc_hider in_stack_ffffffffffffff48;
  _Alloc_hider local_b0;
  string newName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  core = (shared_ptr<helics::Core> *)CONCAT44(in_register_0000003c,type);
  pcVar4 = coreName._M_str;
  type_00 = (CoreType)coreName._M_len;
  newName._M_dataplus._M_p = (pointer)&newName.field_2;
  newName._M_string_length = 0;
  newName.field_2._M_local_buf[0] = '\0';
  if (pcVar4 == (char *)0x0 || type_00 == EXTRACT) {
    helics::core::extractCoreType_abi_cxx11_
              (in_register_0000003c,(char **)in_stack_ffffffffffffff48._M_p);
    local_70._M_dataplus._M_p = (pointer)&newName;
    local_70._M_string_length = (size_type)&newType;
    std::tuple<helics::CoreType&,std::__cxx11::string&>::operator=
              ((tuple<helics::CoreType&,std::__cxx11::string&> *)&local_70,
               (pair<helics::CoreType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&stack0xffffffffffffff48);
    std::__cxx11::string::~string((string *)&local_b0);
    pcVar5 = (char *)newName._M_string_length;
    if (pcVar4 != (char *)0x0) {
      pcVar5 = pcVar4;
    }
    pcVar4 = pcVar5;
    if (type_00 == EXTRACT) {
      type_00 = newType;
    }
  }
  name._M_len = (ulong)type_00;
  name._M_str = pcVar4;
  makeCore(type,name);
  peVar1 = (core->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar1->_vptr_Core[3])(peVar1,(ulong)argv & 0xffffffff);
  bVar2 = registerCore(core,type_00);
  if (!bVar2) {
    this = (RegistrationFailure *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"core ",&local_c5);
    iVar3 = (*((core->super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
              _vptr_Core[0xc])();
    std::operator+(&local_70,&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar3));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffff48,&local_70," failed to register properly");
    message._M_str = in_stack_ffffffffffffff48._M_p;
    message._M_len = (size_t)local_b0._M_p;
    RegistrationFailure::RegistrationFailure(this,message);
    __cxa_throw(this,&RegistrationFailure::typeinfo,HelicsException::~HelicsException);
  }
  std::__cxx11::string::~string((string *)&newName);
  sVar6.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar6.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)core;
  return (shared_ptr<helics::Core>)
         sVar6.super___shared_ptr<helics::Core,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Core> create(CoreType type, std::string_view coreName, int argc, char* argv[])
{
    std::string newName;
    CoreType newType;
    if (type == CoreType::EXTRACT || coreName.empty()) {
        std::tie(newType, newName) = core::extractCoreType(argc, argv);
        if (coreName.empty() && !newName.empty()) {
            coreName = newName;
        }
        if (type == CoreType::EXTRACT) {
            type = newType;
        }
    }
    auto core = makeCore(type, coreName);
    core->configureFromArgs(argc, argv);
    if (!registerCore(core, type)) {
        throw(helics::RegistrationFailure(std::string("core ") + core->getIdentifier() +
                                          " failed to register properly"));
    }

    return core;
}